

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O1

void utrie2_set32_63(UTrie2 *trie,UChar32 c,uint32_t value,UErrorCode *pErrorCode)

{
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if (0x10ffff < (uint)c) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  set32(trie->newTrie,c,'\x01',value,pErrorCode);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
utrie2_set32(UTrie2 *trie, UChar32 c, uint32_t value, UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return;
    }
    if((uint32_t)c>0x10ffff) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    set32(trie->newTrie, c, TRUE, value, pErrorCode);
}